

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O2

void __thiscall icu_63::double_conversion::Bignum::BigitsShiftLeft(Bignum *this,int shift_amount)

{
  uint uVar1;
  uint *puVar2;
  int i;
  long lVar3;
  uint uVar4;
  
  puVar2 = (this->bigits_).start_;
  uVar4 = 0;
  for (lVar3 = 0; lVar3 < this->used_digits_; lVar3 = lVar3 + 1) {
    uVar1 = puVar2[lVar3];
    puVar2[lVar3] = (uVar1 << ((byte)shift_amount & 0x1f)) + uVar4 & 0xfffffff;
    uVar4 = uVar1 >> (0x1c - (byte)shift_amount & 0x1f);
  }
  if (uVar4 != 0) {
    puVar2[this->used_digits_] = uVar4;
    this->used_digits_ = this->used_digits_ + 1;
  }
  return;
}

Assistant:

void Bignum::BigitsShiftLeft(int shift_amount) {
  ASSERT(shift_amount < kBigitSize);
  ASSERT(shift_amount >= 0);
  Chunk carry = 0;
  for (int i = 0; i < used_digits_; ++i) {
    Chunk new_carry = bigits_[i] >> (kBigitSize - shift_amount);
    bigits_[i] = ((bigits_[i] << shift_amount) + carry) & kBigitMask;
    carry = new_carry;
  }
  if (carry != 0) {
    bigits_[used_digits_] = carry;
    used_digits_++;
  }
}